

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O1

Abc_Ntk_t *
Abc_SclBufPerform(Abc_Ntk_t *pNtk,int FanMin,int FanMax,int fBufPis,int fSkipDup,int fVerbose)

{
  int iPivot;
  int iVar1;
  Vec_Que_t *pVVar2;
  int *piVar3;
  int *piVar4;
  float *pfVar5;
  Buf_Man_t *p;
  Abc_Ntk_t *p_00;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  p = Buf_ManStart(pNtk,FanMin,FanMax,fBufPis);
  Abc_NtkLevel(pNtk);
  iVar8 = 0;
  do {
    pVVar2 = p->vQue;
    if (pVVar2->nSize < 1) {
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                    ,0x88,"int Vec_QueSize(Vec_Que_t *)");
    }
    if (pVVar2->nSize == 1) break;
    piVar3 = pVVar2->pHeap;
    piVar4 = pVVar2->pOrder;
    iPivot = piVar3[1];
    piVar4[iPivot] = -1;
    iVar7 = pVVar2->nSize;
    pVVar2->nSize = iVar7 + -1;
    if (iVar7 + -1 == 1) {
      piVar3[1] = -1;
    }
    else {
      iVar1 = piVar3[(long)iVar7 + -1];
      piVar3[(long)iVar7 + -1] = -1;
      piVar3[1] = iVar1;
      piVar4[iVar1] = 1;
      pfVar5 = *pVVar2->pCostsFlt;
      if (pfVar5 == (float *)0x0) {
        fVar12 = (float)iVar1;
      }
      else {
        fVar12 = pfVar5[iVar1];
      }
      iVar7 = pVVar2->nSize;
      uVar11 = 1;
      if (2 < iVar7) {
        uVar9 = 2;
        uVar11 = 1;
        do {
          uVar6 = uVar9 | 1;
          uVar10 = uVar9;
          if ((int)uVar6 < iVar7) {
            if (pfVar5 == (float *)0x0) {
              fVar13 = (float)piVar3[(int)uVar9];
            }
            else {
              fVar13 = pfVar5[piVar3[(int)uVar9]];
            }
            if (pfVar5 == (float *)0x0) {
              fVar14 = (float)piVar3[(int)uVar6];
            }
            else {
              fVar14 = pfVar5[piVar3[(int)uVar6]];
            }
            if (fVar13 < fVar14) {
              uVar10 = uVar6;
            }
          }
          if (iVar7 <= (int)uVar10) {
            __assert_fail("child < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                          ,0xbc,"void Vec_QueMoveDown(Vec_Que_t *, int)");
          }
          iVar7 = piVar3[(int)uVar10];
          if (pfVar5 == (float *)0x0) {
            fVar13 = (float)iVar7;
          }
          else {
            fVar13 = pfVar5[iVar7];
          }
          if (fVar13 <= fVar12) break;
          piVar3[(int)uVar11] = iVar7;
          piVar4[iVar7] = uVar11;
          uVar9 = uVar10 * 2;
          iVar7 = pVVar2->nSize;
          uVar11 = uVar10;
        } while ((int)uVar9 < iVar7);
      }
      piVar3[(int)uVar11] = iVar1;
      piVar4[iVar1] = uVar11;
    }
    Abc_BufPerformOne(p,iPivot,fSkipDup,fVerbose);
    iVar8 = iVar8 + 1;
  } while (iVar8 != 1000000000);
  Buf_ManStop(p);
  p_00 = Abc_NtkDupDfs(pNtk);
  Abc_SclCheckNtk(p_00,fVerbose);
  return p_00;
}

Assistant:

Abc_Ntk_t * Abc_SclBufPerform( Abc_Ntk_t * pNtk, int FanMin, int FanMax, int fBufPis, int fSkipDup, int fVerbose )
{
    Abc_Ntk_t * pNew;
    Buf_Man_t * p = Buf_ManStart( pNtk, FanMin, FanMax, fBufPis );
    int i, Limit = ABC_INFINITY;
    Abc_NtkLevel( pNtk );
//    if ( Abc_NtkNodeNum(pNtk) < 1000 )
//        fSkipDup = 1;
    for ( i = 0; i < Limit && Vec_QueSize(p->vQue); i++ )
        Abc_BufPerformOne( p, Vec_QuePop(p->vQue), fSkipDup, fVerbose );
    Buf_ManStop( p );
//    Abc_BufReplaceBufsByInvs( pNtk );
    // duplicate network in topo order
    pNew = Abc_NtkDupDfs( pNtk );
    Abc_SclCheckNtk( pNew, fVerbose );
    return pNew;
}